

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

void __thiscall diff_match_patch_test::testDiffCommonPrefix(diff_match_patch_test *this)

{
  int iVar1;
  allocator<wchar_t> local_181;
  wstring local_180 [39];
  allocator<wchar_t> local_159;
  wstring local_158 [39];
  allocator<wchar_t> local_131;
  wstring local_130;
  allocator<wchar_t> local_109;
  wstring local_108 [39];
  allocator<wchar_t> local_e1;
  wstring local_e0 [39];
  allocator<wchar_t> local_b9;
  wstring local_b8;
  allocator<wchar_t> local_91;
  wstring local_90 [39];
  allocator<wchar_t> local_69;
  wstring local_68 [55];
  allocator<wchar_t> local_31;
  wstring local_30;
  diff_match_patch_test *local_10;
  diff_match_patch_test *this_local;
  
  local_10 = this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_30,L"diff_commonPrefix: Null case.",&local_31);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"abc",&local_69);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_90,L"xyz",&local_91);
  iVar1 = diff_match_patch::diff_commonPrefix((wstring *)this,local_68);
  assertEquals(this,&local_30,0,iVar1);
  std::__cxx11::wstring::~wstring(local_90);
  std::allocator<wchar_t>::~allocator(&local_91);
  std::__cxx11::wstring::~wstring(local_68);
  std::allocator<wchar_t>::~allocator(&local_69);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  std::allocator<wchar_t>::~allocator(&local_31);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_b8,L"diff_commonPrefix: Non-null case.",&local_b9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_e0,L"1234abcdef",&local_e1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_108,L"1234xyz",&local_109);
  iVar1 = diff_match_patch::diff_commonPrefix((wstring *)this,local_e0);
  assertEquals(this,&local_b8,4,iVar1);
  std::__cxx11::wstring::~wstring(local_108);
  std::allocator<wchar_t>::~allocator(&local_109);
  std::__cxx11::wstring::~wstring(local_e0);
  std::allocator<wchar_t>::~allocator(&local_e1);
  std::__cxx11::wstring::~wstring((wstring *)&local_b8);
  std::allocator<wchar_t>::~allocator(&local_b9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_130,L"diff_commonPrefix: Whole case.",&local_131);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_158,L"1234",&local_159);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_180,L"1234xyz",&local_181);
  iVar1 = diff_match_patch::diff_commonPrefix((wstring *)this,local_158);
  assertEquals(this,&local_130,4,iVar1);
  std::__cxx11::wstring::~wstring(local_180);
  std::allocator<wchar_t>::~allocator(&local_181);
  std::__cxx11::wstring::~wstring(local_158);
  std::allocator<wchar_t>::~allocator(&local_159);
  std::__cxx11::wstring::~wstring((wstring *)&local_130);
  std::allocator<wchar_t>::~allocator(&local_131);
  return;
}

Assistant:

void diff_match_patch_test::testDiffCommonPrefix() {
  // Detect any common prefix.
  assertEquals(L"diff_commonPrefix: Null case.", 0, dmp.diff_commonPrefix(L"abc", L"xyz"));

  assertEquals(L"diff_commonPrefix: Non-null case.", 4, dmp.diff_commonPrefix(L"1234abcdef", L"1234xyz"));

  assertEquals(L"diff_commonPrefix: Whole case.", 4, dmp.diff_commonPrefix(L"1234", L"1234xyz"));
}